

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenTableGet(BinaryenModuleRef module,char *name,BinaryenExpressionRef index,BinaryenType type)

{
  IString *this;
  TableGet *this_00;
  undefined1 reuse;
  string_view sVar1;
  
  reuse = (undefined1)type;
  this = (IString *)strlen(name);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)name;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)reuse);
  this_00 = (TableGet *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression._id = TableGetId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression.type.id = 0;
  (this_00->table).super_IString.str._M_len = 0;
  (this_00->table).super_IString.str = sVar1;
  this_00->index = index;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression.type.id = type;
  wasm::TableGet::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenTableGet(BinaryenModuleRef module,
                                       const char* name,
                                       BinaryenExpressionRef index,
                                       BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeTableGet(name, (Expression*)index, Type(type)));
}